

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv_fs_close(uv_loop_t *loop,uv_fs_t *req,uv_file file,uv_fs_cb cb)

{
  int iVar1;
  uv_fs_cb cb_local;
  uv_file file_local;
  uv_fs_t *req_local;
  uv_loop_t *loop_local;
  
  if (req == (uv_fs_t *)0x0) {
    loop_local._4_4_ = -0x16;
  }
  else {
    req->type = UV_FS;
    req->fs_type = UV_FS_CLOSE;
    req->result = 0;
    req->ptr = (void *)0x0;
    req->loop = loop;
    req->path = (char *)0x0;
    req->new_path = (char *)0x0;
    req->bufs = (uv_buf_t *)0x0;
    req->cb = cb;
    req->file = file;
    if ((cb == (uv_fs_cb)0x0) || (iVar1 = uv__iou_fs_close(loop,req), iVar1 == 0)) {
      if (cb == (uv_fs_cb)0x0) {
        uv__fs_work(&req->work_req);
        loop_local._4_4_ = (int)req->result;
      }
      else {
        (loop->active_reqs).count = (loop->active_reqs).count + 1;
        uv__work_submit(loop,&req->work_req,UV__WORK_FAST_IO,uv__fs_work,uv__fs_done);
        loop_local._4_4_ = 0;
      }
    }
    else {
      loop_local._4_4_ = 0;
    }
  }
  return loop_local._4_4_;
}

Assistant:

int uv_fs_close(uv_loop_t* loop, uv_fs_t* req, uv_file file, uv_fs_cb cb) {
  INIT(CLOSE);
  req->file = file;
  if (cb != NULL)
    if (uv__iou_fs_close(loop, req))
      return 0;
  POST;
}